

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O2

void __thiscall
PlantUmlGenerator::beginState
          (PlantUmlGenerator *this,ostream *output,string *indent,ScName *name,ScName *nameAlias)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  ScName nameShort;
  ScName SStack_48;
  
  removeNamespaces(&SStack_48,name);
  bVar1 = ::AbstractGenerator::isHighlighted(&this->super_AbstractGenerator,name);
  if (bVar1) {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,"state \"");
    poVar2 = std::operator<<(poVar2,(string *)&SStack_48);
    poVar2 = std::operator<<(poVar2,"\" as ");
    poVar2 = std::operator<<(poVar2,(string *)nameAlias);
    pcVar3 = " #IndianRed {\n";
  }
  else {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,"state \"");
    poVar2 = std::operator<<(poVar2,(string *)&SStack_48);
    poVar2 = std::operator<<(poVar2,"\" as ");
    poVar2 = std::operator<<(poVar2,(string *)nameAlias);
    pcVar3 = " {\n";
  }
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::string::append((char *)indent);
  std::__cxx11::string::~string((string *)&SStack_48);
  return;
}

Assistant:

void PlantUmlGenerator::beginState(std::ostream &output, std::string &indent, const ScName &name,
                                   const ScName &nameAlias)
{
    const ScName nameShort = removeNamespaces(name);

    if (isHighlighted(name)) {
        output << indent << "state \"" << nameShort << "\" as " << nameAlias << " #IndianRed {\n";
    } else {
        output << indent << "state \"" << nameShort << "\" as " << nameAlias << " {\n";
    }

    indent.append("  ");
}